

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

RequiredError * CLI::RequiredError::Subcommand(size_t min_subcom)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  RequiredError *in_stack_ffffffffffffff80;
  string local_68 [28];
  ExitCodes in_stack_ffffffffffffffb4;
  string *in_stack_ffffffffffffffb8;
  RequiredError *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [48];
  
  if (in_RSI == 1) {
    paVar1 = &local_31;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"A subcommand",paVar1);
    RequiredError(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ::std::__cxx11::string::~string(local_30);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else {
    __lhs = in_RDI;
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff78);
    ::std::operator+((char *)__lhs,in_stack_ffffffffffffff40);
    ::std::operator+(__lhs,(char *)in_stack_ffffffffffffff40);
    RequiredError(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    ::std::__cxx11::string::~string(local_68);
    ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    ::std::__cxx11::string::~string(local_a8);
  }
  return (RequiredError *)in_RDI;
}

Assistant:

static RequiredError Subcommand(std::size_t min_subcom) {
        if(min_subcom == 1) {
            return RequiredError("A subcommand");
        }
        return {"Requires at least " + std::to_string(min_subcom) + " subcommands", ExitCodes::RequiredError};
    }